

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O3

void __thiscall
TPZFMatrix<long_double>::TPZFMatrix
          (TPZFMatrix<long_double> *this,void **vtt,
          initializer_list<std::initializer_list<long_double>_> *list)

{
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)vtt[3];
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)vtt[2];
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol = 0;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)vtt[1];
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)*vtt;
  TPZVec<int>::TPZVec(&(this->fPivot).super_TPZVec<int>,0);
  (this->fPivot).super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  (this->fPivot).super_TPZVec<int>.fStore = (this->fPivot).fExtAlloc;
  (this->fPivot).super_TPZVec<int>.fNElements = 0;
  (this->fPivot).super_TPZVec<int>.fNAlloc = 0;
  (this->fWork)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813e70;
  (this->fWork).fStore = (longdouble *)0x0;
  (this->fWork).fNElements = 0;
  (this->fWork).fNAlloc = 0;
  Initialize(this,list);
  return;
}

Assistant:

inline TPZFMatrix<TVar>::TPZFMatrix(const std::initializer_list<std::initializer_list<TVar>> &list)
: TPZRegisterClassId(&TPZFMatrix<TVar>::ClassId)
{
    this->Initialize(list);
}